

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableMessageFieldGenerator::GenerateMembers
          (RepeatedImmutableMessageFieldGenerator *this,Printer *printer)

{
  Printer *pPVar1;
  FieldDescriptor *pFVar2;
  string_view end_varname;
  string_view end_varname_00;
  string_view end_varname_01;
  string_view end_varname_02;
  Printer *pPVar3;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *vars;
  Options *pOVar4;
  undefined1 in_R8B;
  undefined1 uVar5;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_300;
  string_view local_2f8;
  string_view local_2e8;
  string_view local_2d8;
  FieldDescriptor local_2c8;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_270;
  basic_string_view<char,_std::char_traits<char>_> local_268;
  string_view local_258;
  string_view local_248;
  FieldDescriptor local_238;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_1e0;
  basic_string_view<char,_std::char_traits<char>_> local_1d8;
  string_view local_1c8;
  string_view local_1b8;
  FieldDescriptor local_1a8;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_150;
  basic_string_view<char,_std::char_traits<char>_> local_148;
  string_view local_138;
  string_view local_128;
  FieldDescriptor local_118;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_c0;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  string_view local_a8;
  string_view local_98 [2];
  undefined1 local_78 [80];
  string_view local_28;
  Printer *local_18;
  Printer *printer_local;
  RepeatedImmutableMessageFieldGenerator *this_local;
  
  vars = &(this->super_ImmutableMessageFieldGenerator).variables_;
  local_18 = printer;
  printer_local = (Printer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,"@SuppressWarnings(\"serial\")\nprivate java.util.List<$type$> $name$_;\n");
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,local_28);
  PrintExtraFieldInfo(vars,local_18);
  pPVar3 = local_18;
  pPVar1 = (Printer *)(this->super_ImmutableMessageFieldGenerator).descriptor_;
  pOVar4 = Context::options((this->super_ImmutableMessageFieldGenerator).context_);
  Options::Options((Options *)local_78,pOVar4);
  WriteFieldDocComment
            ((java *)pPVar3,pPVar1,(FieldDescriptor *)local_78,(Options *)0x0,(bool)in_R8B);
  Options::~Options((Options *)local_78);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_98,
             "@java.lang.Override\n$deprecation$public java.util.List<$type$> ${$get$capitalized_name$List$}$() {\n  return $name$_;\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar1,&(this->super_ImmutableMessageFieldGenerator).variables_,local_98[0]);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b8,"}");
  pFVar2 = (this->super_ImmutableMessageFieldGenerator).descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_c0);
  end_varname_02._M_str = local_b8._M_str;
  end_varname_02._M_len = local_b8._M_len;
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar1,local_a8,end_varname_02,pFVar2,local_c0);
  pPVar3 = local_18;
  uVar5 = SUB81(local_b8._M_str,0);
  pPVar1 = (Printer *)(this->super_ImmutableMessageFieldGenerator).descriptor_;
  pOVar4 = Context::options((this->super_ImmutableMessageFieldGenerator).context_);
  Options::Options((Options *)&local_118,pOVar4);
  WriteFieldDocComment((java *)pPVar3,pPVar1,&local_118,(Options *)0x0,(bool)uVar5);
  Options::~Options((Options *)&local_118);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_128,
             "@java.lang.Override\n$deprecation$public java.util.List<? extends $type$OrBuilder> \n    ${$get$capitalized_name$OrBuilderList$}$() {\n  return $name$_;\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar1,&(this->super_ImmutableMessageFieldGenerator).variables_,local_128);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_138,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_148,"}");
  pFVar2 = (this->super_ImmutableMessageFieldGenerator).descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_150);
  end_varname_01._M_str = local_148._M_str;
  end_varname_01._M_len = local_148._M_len;
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar1,local_138,end_varname_01,pFVar2,local_150);
  pPVar3 = local_18;
  uVar5 = SUB81(local_148._M_str,0);
  pPVar1 = (Printer *)(this->super_ImmutableMessageFieldGenerator).descriptor_;
  pOVar4 = Context::options((this->super_ImmutableMessageFieldGenerator).context_);
  Options::Options((Options *)&local_1a8,pOVar4);
  WriteFieldDocComment((java *)pPVar3,pPVar1,&local_1a8,(Options *)0x0,(bool)uVar5);
  Options::~Options((Options *)&local_1a8);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1b8,
             "@java.lang.Override\n$deprecation$public int ${$get$capitalized_name$Count$}$() {\n  return $name$_.size();\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar1,&(this->super_ImmutableMessageFieldGenerator).variables_,local_1b8);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1c8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1d8,"}");
  pFVar2 = (this->super_ImmutableMessageFieldGenerator).descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_1e0);
  end_varname_00._M_str = local_1d8._M_str;
  end_varname_00._M_len = local_1d8._M_len;
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar1,local_1c8,end_varname_00,pFVar2,local_1e0);
  pPVar3 = local_18;
  uVar5 = SUB81(local_1d8._M_str,0);
  pPVar1 = (Printer *)(this->super_ImmutableMessageFieldGenerator).descriptor_;
  pOVar4 = Context::options((this->super_ImmutableMessageFieldGenerator).context_);
  Options::Options((Options *)&local_238,pOVar4);
  WriteFieldDocComment((java *)pPVar3,pPVar1,&local_238,(Options *)0x0,(bool)uVar5);
  Options::~Options((Options *)&local_238);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_248,
             "@java.lang.Override\n$deprecation$public $type$ ${$get$capitalized_name$$}$(int index) {\n  return $name$_.get(index);\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar1,&(this->super_ImmutableMessageFieldGenerator).variables_,local_248);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_258,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_268,"}");
  pFVar2 = (this->super_ImmutableMessageFieldGenerator).descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_270);
  end_varname._M_str = local_268._M_str;
  end_varname._M_len = local_268._M_len;
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar1,local_258,end_varname,pFVar2,local_270);
  pPVar3 = local_18;
  uVar5 = SUB81(local_268._M_str,0);
  pPVar1 = (Printer *)(this->super_ImmutableMessageFieldGenerator).descriptor_;
  pOVar4 = Context::options((this->super_ImmutableMessageFieldGenerator).context_);
  Options::Options((Options *)&local_2c8,pOVar4);
  WriteFieldDocComment((java *)pPVar3,pPVar1,&local_2c8,(Options *)0x0,(bool)uVar5);
  Options::~Options((Options *)&local_2c8);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_2d8,
             "@java.lang.Override\n$deprecation$public $type$OrBuilder ${$get$capitalized_name$OrBuilder$}$(\n    int index) {\n  return $name$_.get(index);\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar1,&(this->super_ImmutableMessageFieldGenerator).variables_,local_2d8);
  pPVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2e8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2f8,"}");
  pFVar2 = (this->super_ImmutableMessageFieldGenerator).descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_300);
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar1,local_2e8,local_2f8,pFVar2,local_300);
  return;
}

Assistant:

void RepeatedImmutableMessageFieldGenerator::GenerateMembers(
    io::Printer* printer) const {
  printer->Print(variables_, "@SuppressWarnings(\"serial\")\n"
                             "private java.util.List<$type$> $name$_;\n");
  PrintExtraFieldInfo(variables_, printer);
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public java.util.List<$type$> "
                 "${$get$capitalized_name$List$}$() {\n"
                 "  return $name$_;\n"  // note:  unmodifiable list
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  // List<FieldOrBuilder> getFieldOrBuilderList()
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(
      variables_,
      "@java.lang.Override\n"
      "$deprecation$public java.util.List<? extends $type$OrBuilder> \n"
      "    ${$get$capitalized_name$OrBuilderList$}$() {\n"
      "  return $name$_;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);

  // int getFieldCount()
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(
      variables_,
      "@java.lang.Override\n"
      "$deprecation$public int ${$get$capitalized_name$Count$}$() {\n"
      "  return $name$_.size();\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);

  // Field getField(int index)
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(
      variables_,
      "@java.lang.Override\n"
      "$deprecation$public $type$ ${$get$capitalized_name$$}$(int index) {\n"
      "  return $name$_.get(index);\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);

  // FieldOrBuilder getFieldOrBuilder(int index)
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public $type$OrBuilder "
                 "${$get$capitalized_name$OrBuilder$}$(\n"
                 "    int index) {\n"
                 "  return $name$_.get(index);\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
}